

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
mxx::impl::
sample_arbit_decomp<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,impl *this,long begin,
          size_type end,comm *param_5)

{
  unsigned_long uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t i;
  allocator_type local_89;
  vector<int,_std::allocator<int>_> local_splitters;
  value_type my_splitter;
  ulong local_60;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  value_type_conflict1 local_38;
  
  local_size = begin - (long)this >> 2;
  uVar1 = allreduce<unsigned_long,std::plus<unsigned_long>>(&local_size,param_5);
  uVar2 = (long)param_5->m_size * end;
  if (local_size == 0) {
    local_60 = 0;
  }
  else {
    uVar3 = (uVar1 + local_size * uVar2) - 1;
    local_60 = 1;
    if (uVar1 <= uVar3) {
      local_60 = uVar3 / uVar1;
    }
  }
  uVar1 = allreduce<unsigned_long,std::plus<unsigned_long>>(&local_60,param_5);
  if (uVar1 < uVar2) {
    assert_fail("mxx::allreduce(local_s, comm) >= p*s",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
                ,0x71,"sample_arbit_decomp");
  }
  local_splitters.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_splitters.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_splitters.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (local_60 != 0) {
    std::vector<int,_std::allocator<int>_>::resize(&local_splitters,local_60);
    for (uVar2 = 0;
        (long)local_splitters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_splitters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2 != uVar2; uVar2 = uVar2 + 1) {
      this = this + (local_size / (local_60 + 1) + (ulong)(uVar2 < local_size % (local_60 + 1))) * 4
      ;
      local_splitters.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar2] = *(int *)(this + -4);
    }
  }
  distribute_container<std::vector<int,_std::allocator<int>_>_>::distribute_inplace
            (&local_splitters,param_5);
  uVar2 = (long)local_splitters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_splitters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  if (uVar2 != end) {
    if (uVar2 <= end) {
      assert_fail("local_splitters.size() > s",
                  "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
                  ,0x89,"sample_arbit_decomp");
    }
    std::vector<int,_std::allocator<int>_>::resize(&local_splitters,end);
  }
  bitonic_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
            (local_splitters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_splitters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,param_5);
  my_splitter = local_splitters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish[-1];
  local_38 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&recv_sizes,(long)param_5->m_size,&local_38,&local_89);
  recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish[-1] = 0;
  allgatherv<int>(__return_storage_ptr__,&my_splitter,(ulong)(param_5->m_rank + 1 < param_5->m_size)
                  ,&recv_sizes,param_5);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_splitters.super__Vector_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_arbit_decomp(_Iterator begin, _Iterator end, _Compare comp, size_t s, const mxx::comm& comm) {
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    size_t local_size = std::distance(begin, end);

    // get total size n
    size_t total_size = mxx::allreduce(local_size, comm);

    // p = number of processes
    int p = comm.size();

    //  pick a total of s*p samples, thus locally pick ceil((local_size/n)*s*p)
    //  and at least one samples from each processor.
    //  this will result in at least s*p samples.
    size_t local_s;
    if (local_size == 0)
        local_s = 0;
    else
        local_s = std::max<size_t>(((local_size*s*p)+total_size-1)/total_size, 1);

    MXX_ASSERT(mxx::allreduce(local_s, comm) >= p*s);

    // init samples
    std::vector<value_type> local_splitters;

    // pick local samples
    if (local_s > 0) {
        local_splitters.resize(local_s);
        _Iterator pos = begin;
        for (size_t i = 0; i < local_splitters.size(); ++i)
        {
            size_t bucket_size = local_size / (local_s+1) + (i < (local_size % (local_s+1)) ? 1 : 0);
            // pick last element of each bucket
            pos += (bucket_size-1);
            local_splitters[i] = *pos;
            ++pos;
        }
    }

    // distribute elements equally
    mxx::distribute_inplace(local_splitters, comm);

    // discard extra splitters, to make it even
    if (local_splitters.size() != s) {
        MXX_ASSERT(local_splitters.size() > s);
        local_splitters.resize(s);
    }

    // sort splitters using parallel bitonic sort
    bitonic_sort(local_splitters.begin(), local_splitters.end(), comp, comm);

    // select the last element on each process but the last
    value_type my_splitter = local_splitters.back();
    // allgather splitters (from all but the last processor)
    std::vector<size_t> recv_sizes(comm.size(), 1);
    recv_sizes.back() = 0;
    std::vector<value_type> result_splitters = mxx::allgatherv(&my_splitter, (comm.rank() + 1 < comm.size()) ? 1 : 0, recv_sizes, comm);

    // return resulting splitters
    return result_splitters;
}